

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

uint64_t get_sb_source_sad(AV1_COMP *cpi,int mi_row,int mi_col)

{
  int iVar1;
  uint64_t *puVar2;
  int local_4c;
  uint64_t *src_sad_blk_64x64_data;
  uint64_t curr_sb_sad;
  int blk_64x64_row_index;
  int blk_64x64_col_index;
  int num_blk_64x64_rows;
  int num_blk_64x64_cols;
  int blk_64x64_in_mis;
  AV1_COMMON *cm;
  int mi_col_local;
  int mi_row_local;
  AV1_COMP *cpi_local;
  uint64_t local_8;
  
  if (cpi->src_sad_blk_64x64 == (uint64_t *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (((cpi->common).seq_params)->sb_size == BLOCK_128X128) {
      local_4c = ((cpi->common).seq_params)->mib_size >> 1;
    }
    else {
      local_4c = ((cpi->common).seq_params)->mib_size;
    }
    iVar1 = ((cpi->common).mi_params.mi_cols + local_4c + -1) / local_4c;
    curr_sb_sad = 0xffffffffffffffff;
    if ((mi_row / local_4c < ((cpi->common).mi_params.mi_rows + local_4c + -1) / local_4c + -1) &&
       (mi_col / local_4c < iVar1 + -1)) {
      puVar2 = cpi->src_sad_blk_64x64 + (mi_col / local_4c + (mi_row / local_4c) * iVar1);
      if (((cpi->common).seq_params)->sb_size == BLOCK_128X128) {
        curr_sb_sad = *puVar2 + puVar2[1] + puVar2[iVar1] + puVar2[iVar1 + 1];
      }
      else if (((cpi->common).seq_params)->sb_size == BLOCK_64X64) {
        curr_sb_sad = *puVar2;
      }
      local_8 = curr_sb_sad;
    }
    else {
      local_8 = 0xffffffffffffffff;
    }
  }
  return local_8;
}

Assistant:

static inline uint64_t get_sb_source_sad(const AV1_COMP *cpi, int mi_row,
                                         int mi_col) {
  if (cpi->src_sad_blk_64x64 == NULL) return UINT64_MAX;

  const AV1_COMMON *const cm = &cpi->common;
  const int blk_64x64_in_mis = (cm->seq_params->sb_size == BLOCK_128X128)
                                   ? (cm->seq_params->mib_size >> 1)
                                   : cm->seq_params->mib_size;
  const int num_blk_64x64_cols =
      (cm->mi_params.mi_cols + blk_64x64_in_mis - 1) / blk_64x64_in_mis;
  const int num_blk_64x64_rows =
      (cm->mi_params.mi_rows + blk_64x64_in_mis - 1) / blk_64x64_in_mis;
  const int blk_64x64_col_index = mi_col / blk_64x64_in_mis;
  const int blk_64x64_row_index = mi_row / blk_64x64_in_mis;
  uint64_t curr_sb_sad = UINT64_MAX;
  // Avoid the border as sad_blk_64x64 may not be set for the border
  // in the scene detection.
  if ((blk_64x64_row_index >= num_blk_64x64_rows - 1) ||
      (blk_64x64_col_index >= num_blk_64x64_cols - 1)) {
    return curr_sb_sad;
  }
  const uint64_t *const src_sad_blk_64x64_data =
      &cpi->src_sad_blk_64x64[blk_64x64_col_index +
                              blk_64x64_row_index * num_blk_64x64_cols];
  if (cm->seq_params->sb_size == BLOCK_128X128) {
    // Calculate SB source SAD by accumulating source SAD of 64x64 blocks in the
    // superblock
    curr_sb_sad = src_sad_blk_64x64_data[0] + src_sad_blk_64x64_data[1] +
                  src_sad_blk_64x64_data[num_blk_64x64_cols] +
                  src_sad_blk_64x64_data[num_blk_64x64_cols + 1];
  } else if (cm->seq_params->sb_size == BLOCK_64X64) {
    curr_sb_sad = src_sad_blk_64x64_data[0];
  }
  return curr_sb_sad;
}